

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_seckey_tweak_add(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  secp256k1_scalar sStack_48;
  
  if (seckey == (uchar *)0x0) {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "seckey != NULL";
  }
  else {
    if (tweak32 != (uchar *)0x0) {
      uVar1 = secp256k1_scalar_set_b32_seckey(&sStack_48,seckey);
      uVar2 = secp256k1_ec_seckey_tweak_add_helper(&sStack_48,tweak32);
      secp256k1_scalar_cmov(&sStack_48,&secp256k1_scalar_zero,uVar2 & uVar1 ^ 1);
      secp256k1_scalar_get_b32(seckey,&sStack_48);
      return uVar2 & uVar1;
    }
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "tweak32 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar4,pvVar3);
  return 0;
}

Assistant:

int secp256k1_ec_seckey_tweak_add(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar sec;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= secp256k1_ec_seckey_tweak_add_helper(&sec, tweak32);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    return ret;
}